

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir_resize_init(STBIR_RESIZE *resize,void *input_pixels,int input_w,int input_h,
                      int input_stride_in_bytes,void *output_pixels,int output_w,int output_h,
                      int output_stride_in_bytes,stbir_pixel_layout pixel_layout,
                      stbir_datatype data_type)

{
  void *output_pixels_local;
  int input_stride_in_bytes_local;
  int input_h_local;
  int input_w_local;
  void *input_pixels_local;
  STBIR_RESIZE *resize_local;
  
  resize->input_pixels = input_pixels;
  resize->input_w = input_w;
  resize->input_h = input_h;
  resize->input_stride_in_bytes = input_stride_in_bytes;
  resize->output_pixels = output_pixels;
  resize->output_w = output_w;
  resize->output_h = output_h;
  resize->output_stride_in_bytes = output_stride_in_bytes;
  resize->fast_alpha = 0;
  stbir__init_and_set_layout(resize,pixel_layout,data_type);
  return;
}

Assistant:

STBIRDEF void stbir_resize_init( STBIR_RESIZE * resize,
                                 const void *input_pixels,  int input_w,  int input_h, int input_stride_in_bytes, // stride can be zero
                                       void *output_pixels, int output_w, int output_h, int output_stride_in_bytes, // stride can be zero
                                 stbir_pixel_layout pixel_layout, stbir_datatype data_type )
{
  resize->input_pixels = input_pixels;
  resize->input_w = input_w;
  resize->input_h = input_h;
  resize->input_stride_in_bytes = input_stride_in_bytes;
  resize->output_pixels = output_pixels;
  resize->output_w = output_w;
  resize->output_h = output_h;
  resize->output_stride_in_bytes = output_stride_in_bytes;
  resize->fast_alpha = 0;

  stbir__init_and_set_layout( resize, pixel_layout, data_type );
}